

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_catalog.cpp
# Opt level: O2

void __thiscall
duckdb::DuckCatalog::DropSchema(DuckCatalog *this,CatalogTransaction transaction,DropInfo *info)

{
  bool bVar1;
  pointer this_00;
  CatalogException *__return_storage_ptr__;
  string local_38;
  
  this_00 = unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>::
            operator->(&this->schemas);
  bVar1 = CatalogSet::DropEntry(this_00,transaction,&info->name,info->cascade,false);
  if ((!bVar1) && (info->if_not_found == THROW_EXCEPTION)) {
    __return_storage_ptr__ = (CatalogException *)__cxa_allocate_exception(0x10);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    local_38._M_string_length = 0;
    local_38.field_2._M_local_buf[0] = '\0';
    CatalogException::MissingEntry
              (__return_storage_ptr__,SCHEMA_ENTRY,&info->name,&local_38,
               (QueryErrorContext)0xffffffffffffffff);
    __cxa_throw(__return_storage_ptr__,&CatalogException::typeinfo,
                ::std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void DuckCatalog::DropSchema(CatalogTransaction transaction, DropInfo &info) {
	D_ASSERT(!info.name.empty());
	if (!schemas->DropEntry(transaction, info.name, info.cascade)) {
		if (info.if_not_found == OnEntryNotFound::THROW_EXCEPTION) {
			throw CatalogException::MissingEntry(CatalogType::SCHEMA_ENTRY, info.name, string());
		}
	}
}